

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall Gluco::vec<double>::capacity(vec<double> *this,int min_cap)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  undefined8 uVar4;
  int add;
  int min_cap_local;
  vec<double> *this_local;
  
  if (min_cap <= this->cap) {
    return;
  }
  iVar1 = imax((min_cap - this->cap) + 1U & 0xfffffffe,(this->cap >> 1) + 2U & 0xfffffffe);
  if (iVar1 <= 0x7fffffff - this->cap) {
    iVar1 = iVar1 + this->cap;
    this->cap = iVar1;
    pdVar2 = (double *)realloc(this->data,(long)iVar1 << 3);
    this->data = pdVar2;
    if (pdVar2 != (double *)0x0) {
      return;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0xc) {
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void vec<T>::capacity(int min_cap) {
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap || (((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM))
        throw OutOfMemoryException();
 }